

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type
time_plain<boost::random::additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,40014u,0u,2147483563u>,boost::random::linear_congruential_engine<unsigned_int,40692u,0u,2147483399u>>>
          (additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
           *r)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  result_type rVar6;
  ulong uVar7;
  long lVar8;
  string res;
  string local_40;
  double local_20;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  uVar4 = (ulong)(r->_mlcg1)._x;
  uVar7 = (ulong)(r->_mlcg2)._x;
  rVar6 = 0;
  lVar8 = 0x1000000;
  do {
    uVar4 = (uVar4 * 0x9c4e) % 0x7fffffab;
    uVar7 = (uVar7 & 0xffffffff) * 0x9ef4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar7 = uVar7 + (ulong)(SUB164(auVar1 * ZEXT816(0x4000007c8001),8) >> 0xd) * -0x7fffff07;
    iVar2 = (uint)uVar4 - (uint)uVar7;
    iVar5 = iVar2 + 0x7fffffaa;
    if (uVar7 < uVar4) {
      iVar5 = iVar2;
    }
    rVar6 = rVar6 + iVar5;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  (r->_mlcg1)._x = (uint)uVar4;
  (r->_mlcg2)._x = (uint)uVar7;
  lVar8 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar8 - lVar3) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar6;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}